

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::~DataFlowOpts(DataFlowOpts *this)

{
  ~DataFlowOpts(this);
  operator_delete(this,0x390);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<DataFlowOpts>();
  }